

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip38.c
# Opt level: O3

void aes_enc_impl(uchar *src,uchar *xor,uchar *key,uchar *bytes_out)

{
  uchar plaintext [16];
  uint local_18;
  uint uStack_14;
  uint uStack_10;
  uint uStack_c;
  
  local_18 = *(uint *)xor ^ *(uint *)src;
  uStack_14 = *(uint *)(xor + 4) ^ *(uint *)(src + 4);
  uStack_10 = *(uint *)(xor + 8) ^ *(uint *)(src + 8);
  uStack_c = *(uint *)(xor + 0xc) ^ *(uint *)(src + 0xc);
  wally_aes(key,0x20,(uchar *)&local_18,0x10,1,bytes_out,0x10);
  wally_clear(&local_18,0x10);
  return;
}

Assistant:

static void aes_enc_impl(const unsigned char *src, const unsigned char *xor,
                         const unsigned char *key, unsigned char *bytes_out)
{
    unsigned char plaintext[AES_BLOCK_LEN];
    size_t i;

    for (i = 0; i < sizeof(plaintext); ++i)
        plaintext[i] = src[i] ^ xor[i];

    wally_aes(key, AES_KEY_LEN_256, plaintext, AES_BLOCK_LEN,
              AES_FLAG_ENCRYPT, bytes_out, AES_BLOCK_LEN);

    wally_clear(plaintext, sizeof(plaintext));
}